

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

string * __thiscall
cmCTestMultiProcessHandler::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestMultiProcessHandler *this,int test)

{
  mapped_type *ppcVar1;
  int local_c;
  
  local_c = test;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(*ppcVar1)->Name);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestMultiProcessHandler::GetName(int test)
{
  return this->Properties[test]->Name;
}